

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O2

void __thiscall wasm::DataFlowOpts::DataFlowOpts(DataFlowOpts *this)

{
  WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>::
  WalkerPass(&this->
              super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>
            );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>)
  .super_Pass._vptr_Pass = (_func_int **)&PTR__DataFlowOpts_01120340;
  (this->nodeUsers).users._M_h._M_buckets = &(this->nodeUsers).users._M_h._M_single_bucket;
  (this->nodeUsers).users._M_h._M_bucket_count = 1;
  (this->nodeUsers).users._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodeUsers).users._M_h._M_element_count = 0;
  (this->nodeUsers).users._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodeUsers).users._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodeUsers).users._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->workLeft)._M_h._M_buckets = &(this->workLeft)._M_h._M_single_bucket;
  (this->workLeft)._M_h._M_bucket_count = 1;
  (this->workLeft)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->workLeft)._M_h._M_element_count = 0;
  (this->workLeft)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->workLeft)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->workLeft)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  DataFlow::Graph::Graph(&this->graph);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }